

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGCG_SolverNonserialDynamicProgramming.cpp
# Opt level: O2

LIndex __thiscall
BGCG_SolverNonserialDynamicProgramming::GetJpolIndexForBestResponses
          (BGCG_SolverNonserialDynamicProgramming *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *agentOrdering)

{
  pointer pSVar1;
  int iVar2;
  Index IVar3;
  undefined4 extraout_var;
  LIndex i;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  Scope *sc;
  pointer puVar7;
  long lVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> selectedBRIs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrPols;
  vector<unsigned_int,_std::allocator<unsigned_int>_> restrictedBRIs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrNeighborsPolicies;
  allocator_type local_a9;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_90;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  ulong local_68;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)(this->super_BGCG_Solver)._m_bgcg.px;
  local_88._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(this->super_BGCG_Solver)._m_bgcg.pn.pi_;
  if ((sp_counted_base *)local_88._M_impl.super__Vector_impl_data._M_finish !=
      (sp_counted_base *)0x0) {
    LOCK();
    ((sp_counted_base *)local_88._M_impl.super__Vector_impl_data._M_finish)->use_count_ =
         ((sp_counted_base *)local_88._M_impl.super__Vector_impl_data._M_finish)->use_count_ + 1;
    UNLOCK();
  }
  local_90 = agentOrdering;
  iVar2 = (*(((element_type *)local_88._M_impl.super__Vector_impl_data._M_start)->
            super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
            super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
            _vptr_Interface_ProblemToPolicyDiscrete[3])();
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_88._M_impl.super__Vector_impl_data._M_finish);
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar5 = 0; uVar5 < CONCAT44(extraout_var,iVar2); uVar5 = (ulong)((Index)uVar5 + 1)) {
    local_a8._M_impl.super__Vector_impl_data._M_start =
         (pointer)(this->super_BGCG_Solver)._m_bgcg.px;
    local_a8._M_impl.super__Vector_impl_data._M_finish =
         (pointer)(this->super_BGCG_Solver)._m_bgcg.pn.pi_;
    if ((sp_counted_base *)local_a8._M_impl.super__Vector_impl_data._M_finish !=
        (sp_counted_base *)0x0) {
      LOCK();
      ((sp_counted_base *)local_a8._M_impl.super__Vector_impl_data._M_finish)->use_count_ =
           ((sp_counted_base *)local_a8._M_impl.super__Vector_impl_data._M_finish)->use_count_ + 1;
      UNLOCK();
    }
    i = BayesianGameBase::GetNrPolicies
                  ((BayesianGameBase *)local_a8._M_impl.super__Vector_impl_data._M_start,
                   (Index)uVar5);
    IVar3 = Globals::CastLIndexToIndex(i);
    local_60._M_impl.super__Vector_impl_data._M_start = (pointer)(ulong)IVar3;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_88,
               (unsigned_long *)&local_60);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_a8._M_impl.super__Vector_impl_data._M_finish);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,
             CONCAT44(extraout_var,iVar2),(allocator_type *)&local_60);
  for (puVar7 = (local_90->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      puVar7 != (local_90->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start; puVar7 = puVar7 + -1) {
    uVar5 = (ulong)puVar7[-1];
    pSVar1 = (this->_m_bestResponseScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl
             .super__Vector_impl_data._M_start;
    lVar8 = (long)pSVar1[uVar5].super_SDT.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            *(long *)&pSVar1[uVar5].super_SDT.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
    if (lVar8 == 0) {
      uVar4 = 0;
      uVar6 = uVar5;
    }
    else {
      local_68 = uVar5;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60,lVar8 >> 2,
                 (allocator_type *)&local_48);
      sc = pSVar1 + uVar5;
      IndexTools::RestrictIndividualIndicesToScope<unsigned_int>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,sc,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,
                 (long)(sc->super_SDT).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(sc->super_SDT).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2,&local_a9);
      IndexTools::RestrictIndividualIndicesToScope<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_88,sc,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48);
      IVar3 = IndexTools::IndividualToJointIndices
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48);
      IVar3 = Globals::CastLIndexToIndex((ulong)IVar3);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_60);
      uVar4 = (ulong)IVar3;
      uVar6 = local_68;
    }
    *(undefined4 *)
     ((long)&(((BayesianGameIdenticalPayoffInterface *)
              local_a8._M_impl.super__Vector_impl_data._M_start)->super_BayesianGameBase).
             super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
             _vptr_Interface_ProblemToPolicyDiscrete + uVar6 * 4) =
         *(undefined4 *)
          (*(long *)&(this->_m_bestResponses).
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar5].
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data + uVar4 * 4);
  }
  IVar3 = IndexTools::IndividualToJointIndices
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_88);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_a8);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_88);
  return (ulong)IVar3;
}

Assistant:

LIndex 
BGCG_SolverNonserialDynamicProgramming::GetJpolIndexForBestResponses(const vector<Index> &agentOrdering) const
{
    size_t nrAgents = GetBGCG()->GetNrAgents();

    //Get the nr of policies for all agents
    vector<size_t> nrPols;
    for(Index agI=0; agI < nrAgents; agI++)
        nrPols.push_back(CastLIndexToIndex(GetBGCG()->GetNrPolicies(agI)));

//we store the index, not the policy itelf
//JointPolicyPureVector(*cgbg, TYPE_INDEX ) bestJointBGPolicy;
    vector<Index > selectedBRIs(nrAgents);

    Index neighJointPol = 0;
    vector<Index>::const_reverse_iterator rit = agentOrdering.rbegin();
    while(rit != agentOrdering.rend())
    {
        Index agI=*rit;
        const Scope& brSc = _m_bestResponseScopes[agI];
#if DEBUG_BGCG_SolverNonserialDynamicProgramming
        cout << "selecting best response policy for agent "<< agI <<
            ". bestResponseScope(its neighbors) is " <<
            SoftPrint(brSc) << endl;
#endif        
        if(brSc.size() > 0)
        {
            //get the policies selected by the agents in brSc and convert
            //it to neighJointPol index
            vector<Index> restrictedBRIs(brSc.size());
            IndexTools::RestrictIndividualIndicesToScope(selectedBRIs, brSc,
                                                         restrictedBRIs);
            vector<size_t> nrNeighborsPolicies(brSc.size());
            IndexTools::RestrictIndividualIndicesToScope(nrPols, brSc,
                nrNeighborsPolicies);
/*            for(Scope::const_iterator brSc_it = brSc.begin(); 
                    brSc_it != brSc.end(); brSc_it++)
            {
                size_t nrpols = cgbg->GetNrPolicies(*brSc_it);
                nrNeighborsPolicies.push_back(nrpols);
//                nrJointNeighborPolicies *= nrpols;
            }
*/            
            Index brSc_jointIndex = CastLIndexToIndex(IndexTools::IndividualToJointIndices
                                                      (restrictedBRIs, nrNeighborsPolicies));
            neighJointPol = brSc_jointIndex;
        }
        else
            neighJointPol = 0;

        selectedBRIs[agI] = _m_bestResponses[agI][neighJointPol];

#if 0 && DEBUG_BGCG_SolverNonserialDynamicProgramming
        PolicyPureVector brPol(*GetBGCG(), agI, TYPE_INDEX);
        brPol.SetIndex(selectedBRIs[agI]);
        cout << "selecting best response for joint neighbor index "<< 
            neighJointPol <<endl;
        cout << "selected policy index selectedBRIs[agI]="<< selectedBRIs[agI]
             <<", corresponding to BG policy:"<<endl
             <<brPol.SoftPrint();
#endif        
        rit++;
    }
    
    //Get the joint policy index
    LIndex bestJointBGPolicyIndex = IndexTools::IndividualToJointIndices(
            selectedBRIs, nrPols);

    return(bestJointBGPolicyIndex);
}